

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::DTDScanner::scanEnumeration
          (DTDScanner *this,DTDAttDef *attDef,XMLBuffer *toFill,bool notation)

{
  XMLBufferMgr *this_00;
  XMLSize_t count;
  XMLCh *chars;
  XMLScanner *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  XMLBufBid bbTmp;
  
  toFill->fIndex = 0;
  checkForPERef(this,false,true);
  if ((int)CONCAT71(in_register_00000009,notation) != 0) {
    bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'(');
    if (!bVar1) {
      XMLScanner::emitError(this->fScanner,ExpectedOpenParen);
    }
  }
  this_00 = this->fBufMgr;
  bbTmp.fBuffer = XMLBufferMgr::bidOnBuffer(this_00);
  bbTmp.fMgr = this_00;
  do {
    checkForPERef(this,false,true);
    if (notation) {
      bVar1 = ReaderMgr::getName(this->fReaderMgr,bbTmp.fBuffer);
    }
    else {
      bVar1 = ReaderMgr::getNameToken(this->fReaderMgr,bbTmp.fBuffer);
    }
    if (bVar1 == false) {
      this_01 = this->fScanner;
      iVar2 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
      bVar1 = false;
      XMLScanner::emitError
                (this_01,ExpectedEnumValue,(XMLCh *)CONCAT44(extraout_var,iVar2),(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_002f7e59;
    }
    count = (bbTmp.fBuffer)->fIndex;
    chars = (bbTmp.fBuffer)->fBuffer;
    chars[count] = L'\0';
    XMLBuffer::append(toFill,chars,count);
    checkForPERef(this,false,true);
    bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L')');
    if (bVar1) {
      bVar1 = true;
      goto LAB_002f7e59;
    }
    XMLBuffer::append(toFill,L' ');
    bVar1 = ReaderMgr::skippedChar(this->fReaderMgr,L'|');
  } while (bVar1);
  XMLScanner::emitError(this->fScanner,ExpectedEnumSepOrParen);
  bVar1 = false;
LAB_002f7e59:
  XMLBufBid::~XMLBufBid(&bbTmp);
  return bVar1;
}

Assistant:

bool DTDScanner::scanEnumeration( const   DTDAttDef&  attDef
                                    ,       XMLBuffer&  toFill
                                    , const bool        notation)
{
    // Reset the passed buffer
    toFill.reset();

    // Check for PE ref but don't require space
    checkForPERef(false, true);

    // If this is a notation, we need an opening paren
    if (notation)
    {
        if (!fReaderMgr->skippedChar(chOpenParen))
            fScanner->emitError(XMLErrs::ExpectedOpenParen);
    }

    // We need a local buffer to use as well
    XMLBufBid bbTmp(fBufMgr);

    while (true)
    {
        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // And then get either a name or a name token
        bool success;
        if (notation)
            success = fReaderMgr->getName(bbTmp.getBuffer());
        else
            success = fReaderMgr->getNameToken(bbTmp.getBuffer());

        if (!success)
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedEnumValue
                , attDef.getFullName()
            );
            return false;
        }

        // Append this value to the target value
        toFill.append(bbTmp.getRawBuffer(), bbTmp.getLen());

        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // Check for the terminating paren
        if (fReaderMgr->skippedChar(chCloseParen))
            break;

        // And append a space separator
        toFill.append(chSpace);

        // Check for the pipe character separator
        if (!fReaderMgr->skippedChar(chPipe))
        {
            fScanner->emitError(XMLErrs::ExpectedEnumSepOrParen);
            return false;
        }
    }
    return true;
}